

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_smart_pointers.cpp
# Opt level: O2

void use_unique_pointer(void)

{
  string *psVar1;
  pointer __p;
  int i;
  allocator local_54;
  allocator local_53;
  allocator local_52;
  allocator local_51;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pwin;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  films [5];
  
  psVar1 = (string *)operator_new(0x20);
  std::__cxx11::string::string(psVar1,"The Iron Man",(allocator *)&pwin);
  psVar1 = (string *)operator_new(0x20);
  std::__cxx11::string::string(psVar1,"The amazing four",&local_51);
  __p = (pointer)operator_new(0x20);
  std::__cxx11::string::string((string *)__p,"Capital America",&local_52);
  psVar1 = (string *)operator_new(0x20);
  std::__cxx11::string::string(psVar1,"The spiderman",&local_53);
  psVar1 = (string *)operator_new(0x20);
  std::__cxx11::string::string(psVar1,"The superman",&local_54);
  pwin._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&pwin,__p);
  std::operator<<((ostream *)&std::cout,"The mavel movies are:\n");
}

Assistant:

void use_unique_pointer() {
    using namespace std;

    unique_ptr<string> films[5] = {
            unique_ptr<string>(new string("The Iron Man")),
            unique_ptr<string>(new string("The amazing four")),
            unique_ptr<string>(new string("Capital America")),
            unique_ptr<string>(new string("The spiderman")),
            unique_ptr<string>(new string("The superman")),
    };

    unique_ptr<string> pwin;
    //  unique pointer cannot be rvalue when assign directly
//    pwin = films[2];
    //  when use std::move to pass ownership, it will be like auto_ptr
    pwin = std::move(films[2]);

    std::cout << "The mavel movies are:\n";
    for (int i = 0; i < 5; i++) {
        if (films[i] != nullptr) {
            std::cout << *films[i] << std::endl;
        } else {
            std::cout << i << " is empty" << std::endl;
        }
    }
    std::cout << "The winner is " << *pwin << "!\n";
}